

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

int Ucs1CopyDataProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                    Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  uint uVar2;
  uint *puVar3;
  CopyDataInfo *info;
  uint *data;
  
  if (length != 0) {
    data = (uint *)chunks->data;
    do {
      CVar1 = chunks->format;
      uVar2 = 0xffffffff;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          uVar2 = (uint)(byte)*data;
        }
        else if (CVar1 == COL_UCS2) {
          uVar2 = (uint)(ushort)*data;
        }
      }
      else if (CVar1 == COL_UCS4) {
        uVar2 = *data;
      }
      else if (CVar1 == COL_UTF8) {
        uVar2 = Col_Utf8Get((Col_Char1 *)data);
      }
      else if (CVar1 == COL_UTF16) {
        uVar2 = Col_Utf16Get((Col_Char2 *)data);
      }
      if ((uVar2 < 0x100) || (uVar2 = *(uint *)((long)clientData + 8), uVar2 != 0xffffffff)) {
        **clientData = (char)uVar2;
        *(long *)clientData = *clientData + 1;
      }
      CVar1 = chunks->format;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          puVar3 = (uint *)((long)data + 1);
        }
        else {
          puVar3 = (uint *)0x0;
          if (CVar1 == COL_UCS2) {
            puVar3 = (uint *)((long)data + 2);
          }
        }
      }
      else if (CVar1 == COL_UCS4) {
        puVar3 = data + 1;
      }
      else if (CVar1 == COL_UTF8) {
        puVar3 = (uint *)Col_Utf8Next((Col_Char1 *)data);
      }
      else {
        puVar3 = (uint *)0x0;
        if (CVar1 == COL_UTF16) {
          puVar3 = (uint *)Col_Utf16Next((Col_Char2 *)data);
        }
      }
      length = length - 1;
      data = puVar3;
    } while (length != 0);
  }
  return 0;
}

Assistant:

static int
Ucs1CopyDataProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #CopyDataInfo. */
    Col_ClientData clientData)
{
    CopyDataInfo *info = (CopyDataInfo *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c > COL_CHAR1_MAX) {
            if (info->replace == COL_CHAR_INVALID) continue;
            c = info->replace;
        }
        *(Col_Char1 *) info->data = c;
        info->data += CHAR_WIDTH(COL_UCS1);
    }
    return 0;
}